

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Opnd * __thiscall Lowerer::CreateOpndForSlotAccess(Lowerer *this,Opnd *opnd)

{
  _func_int **pp_Var1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *pJVar7;
  AsmJsJITInfo *this_00;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar8;
  SymOpnd *this_01;
  StackSym *pSVar9;
  Func *pFVar10;
  int offset;
  
  OVar3 = IR::Opnd::GetKind(opnd);
  if (OVar3 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar4) goto LAB_005d6c07;
    *puVar6 = 0;
  }
  pp_Var1 = opnd[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var1 + 0x14) != '\x02') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
    if (!bVar4) {
LAB_005d6c07:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  bVar4 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
  pFVar10 = this->m_func;
  if (((!bVar4) && (pFVar10->stackClosure == true)) &&
     ((pSVar9 = (StackSym *)pp_Var1[4], pSVar9 == pFVar10->m_localClosureSym ||
      (pSVar9 == pFVar10->m_localFrameDisplaySym)))) {
    this_01 = IR::SymOpnd::New((Sym *)pSVar9,0,TyInt64,pFVar10);
    pSVar9 = IR::Opnd::GetStackSym(&this_01->super_Opnd);
    pSVar9->field_0x1b = pSVar9->field_0x1b | 0x10;
    return &this_01->super_Opnd;
  }
  offset = *(int *)(pp_Var1 + 3);
  pJVar7 = JITTimeWorkItem::GetJITFunctionBody(pFVar10->m_workItem);
  bVar4 = JITTimeFunctionBody::IsAsmJsMode(pJVar7);
  if (!bVar4) {
    offset = offset * TySize[opnd->m_type];
  }
  pFVar10 = this->m_func;
  if ((pFVar10->field_0x242 & 2) != 0) {
    pJVar7 = JITTimeWorkItem::GetJITFunctionBody(pFVar10->m_workItem);
    this_00 = JITTimeFunctionBody::GetAsmJsInfo(pJVar7);
    iVar5 = AsmJsJITInfo::GetTotalSizeInBytes(this_00);
    offset = offset - iVar5;
    pFVar10 = this->m_func;
  }
  baseOpnd = IR::SymOpnd::CreatePropertyOwnerOpnd((SymOpnd *)opnd,pFVar10);
  pIVar8 = IR::IndirOpnd::New(baseOpnd,offset,opnd->m_type,this->m_func,false);
  return &pIVar8->super_Opnd;
}

Assistant:

IR::Opnd *
Lowerer::CreateOpndForSlotAccess(IR::Opnd * opnd)
{
    IR::SymOpnd * symOpnd = opnd->AsSymOpnd();
    PropertySym * dstSym = symOpnd->m_sym->AsPropertySym();

    if (!m_func->IsLoopBody() &&
        m_func->DoStackFrameDisplay() &&
        (dstSym->m_stackSym == m_func->GetLocalClosureSym() || dstSym->m_stackSym == m_func->GetLocalFrameDisplaySym()))
    {
        // Stack closure syms are made to look like slot accesses for the benefit of GlobOpt, so that it can do proper
        // copy prop and implicit call bailout. But what we really want is local stack load/store.
        // Don't do this for loop body, though, since we don't have the value saved on the stack.
        IR::SymOpnd * closureSym = IR::SymOpnd::New(dstSym->m_stackSym, 0, TyMachReg, this->m_func);
        closureSym->GetStackSym()->m_isClosureSym = true;
        return closureSym;
    }

    int32 offset = dstSym->m_propertyId;
    if (!m_func->GetJITFunctionBody()->IsAsmJsMode())
    {
        offset = offset * TySize[opnd->GetType()];
    }
#ifdef ASMJS_PLAT
    if (m_func->IsTJLoopBody())
    {
        offset = offset - m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetTotalSizeInBytes();
    }
#endif

    IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(symOpnd->CreatePropertyOwnerOpnd(m_func),
       offset , opnd->GetType(), this->m_func);
    return indirOpnd;
}